

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCDecoder.h
# Opt level: O2

void __thiscall
o3dgc::SC3DMCDecoder<unsigned_short>::SC3DMCDecoder(SC3DMCDecoder<unsigned_short> *this)

{
  SC3DMCEncodeParams::SC3DMCEncodeParams(&this->m_params);
  TriangleListDecoder<unsigned_short>::TriangleListDecoder(&this->m_triangleListDecoder);
  this->m_iterator = 0;
  this->m_streamSize = 0;
  memset(&this->m_quantFloatArray,0,0x2074);
  return;
}

Assistant:

SC3DMCDecoder(void)
                                    {
                                        m_iterator            = 0;
                                        m_streamSize          = 0;
                                        m_quantFloatArray     = 0;
                                        m_quantFloatArraySize = 0;
                                        m_normals             = 0;
                                        m_normalsSize         = 0;
                                        m_streamType          = O3DGC_STREAM_TYPE_UNKOWN;
                                    }